

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

format_arg * __thiscall
fmt::v5::
basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::do_get(format_arg *__return_storage_ptr__,
        basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *this,size_type index)

{
  longlong *plVar1;
  undefined8 *puVar2;
  size_t sVar3;
  longlong lVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  
  uVar7 = *(ulong *)this;
  if (-1 < (long)uVar7) {
    (__return_storage_ptr__->value_).field_0.int_value = 0;
    __return_storage_ptr__->type_ = none_type;
    if ((index < 0x10) &&
       (uVar7 = uVar7 >> ((char)index * '\x04' & 0x3fU),
       __return_storage_ptr__->type_ = (type)uVar7 & (pointer_type|uint_type), (uVar7 & 0xf) != 0))
    {
      plVar1 = (longlong *)(*(long *)(this + 8) + (ulong)index * 0x10);
      sVar3 = plVar1[1];
      (__return_storage_ptr__->value_).field_0.long_long_value = *plVar1;
      (__return_storage_ptr__->value_).field_0.string.size = sVar3;
    }
    return __return_storage_ptr__;
  }
  if ((ulong)index < -uVar7) {
    lVar6 = (ulong)index * 0x20;
    plVar1 = (longlong *)(*(long *)(this + 8) + lVar6);
    lVar4 = *plVar1;
    sVar3 = plVar1[1];
    puVar2 = (undefined8 *)(*(long *)(this + 8) + 0x10 + lVar6);
    uVar5 = puVar2[1];
    *(undefined8 *)&__return_storage_ptr__->type_ = *puVar2;
    *(undefined8 *)&__return_storage_ptr__->field_0x18 = uVar5;
    (__return_storage_ptr__->value_).field_0.long_long_value = lVar4;
    (__return_storage_ptr__->value_).field_0.string.size = sVar3;
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->value_).field_0.int_value = 0;
  __return_storage_ptr__->type_ = none_type;
  return __return_storage_ptr__;
}

Assistant:

format_arg do_get(size_type index) const {
    long long signed_types = static_cast<long long>(types_);
    if (signed_types < 0) {
      unsigned long long num_args =
          static_cast<unsigned long long>(-signed_types);
      return index < num_args ? args_[index] : format_arg();
    }
    format_arg arg;
    if (index > internal::max_packed_args)
      return arg;
    arg.type_ = type(index);
    if (arg.type_ == internal::none_type)
      return arg;
    internal::value<Context> &val = arg.value_;
    val = values_[index];
    return arg;
  }